

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O1

void nni_posix_resolv_sysfini(void)

{
  long lVar1;
  long lVar2;
  
  nni_mtx_lock(&resolv_mtx);
  resolv_fini = 1;
  nni_cv_wake(&resolv_cv);
  nni_mtx_unlock(&resolv_mtx);
  if (resolv_thrs != (nni_thr *)0x0) {
    if (0 < resolv_num_thr) {
      lVar1 = 0;
      lVar2 = 0;
      do {
        nni_thr_fini((nni_thr *)((long)&(resolv_thrs->thr).tid + lVar1));
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x98;
      } while (lVar2 < resolv_num_thr);
    }
    nni_free(resolv_thrs,(long)resolv_num_thr * 0x98);
  }
  if (resolv_active != (nni_aio **)0x0) {
    nni_free(resolv_active,(long)resolv_num_thr << 3);
  }
  nni_cv_fini(&resolv_cv);
  nni_mtx_fini(&resolv_mtx);
  return;
}

Assistant:

void
nni_posix_resolv_sysfini(void)
{
	nni_mtx_lock(&resolv_mtx);
	resolv_fini = true;
	nni_cv_wake(&resolv_cv);
	nni_mtx_unlock(&resolv_mtx);

	if (resolv_thrs != NULL) {
		for (int i = 0; i < resolv_num_thr; i++) {
			nni_thr_fini(&resolv_thrs[i]);
		}
		NNI_FREE_STRUCTS(resolv_thrs, resolv_num_thr);
	}
	if (resolv_active != NULL) {
		nni_free(resolv_active, sizeof(nni_aio *) * resolv_num_thr);
	}
	nni_cv_fini(&resolv_cv);
	nni_mtx_fini(&resolv_mtx);
}